

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

bool __thiscall
ON_SubDLevel::CopyEvaluationCacheForExperts
          (ON_SubDLevel *this,ON_SubDHeap *this_heap,ON_SubDLevel *src,ON_SubDHeap *src_heap,
          uint *copy_status)

{
  uint level_index;
  uint level_index_00;
  ON_SubDSectorSurfacePoint limit_point;
  bool bVar1;
  bool bVar2;
  uint destination_subd_display_density;
  uint uVar3;
  uint uVar4;
  ON_SubDMeshFragment *pOVar5;
  ON_SubDMeshFragment *this_frag;
  ON_SimpleArray<ON_3dPoint> edge_curve_cvs;
  ON_SubDSectorSurfacePoint *pOStack_330;
  uint vfi_1;
  ON_SubDSectorSurfacePoint *src_limit_point;
  ON_SubDSectorSurfacePoint this_limit_point;
  double subdivision_point [3];
  ushort local_292;
  undefined1 local_290 [6];
  unsigned_short fei;
  ON_3dPoint local_278;
  byte local_259;
  ON_SubDEdgePtr *pOStack_258;
  bool bCopyFaceCache;
  ON_SubDEdgePtr *src_eptr;
  ON_SubDEdgePtr *this_eptr;
  ON_SubDFaceIdIterator src_fit;
  ON_SubDFaceIdIterator this_fit;
  undefined1 local_1f0 [6];
  unsigned_short efi;
  ON_3dPoint local_1d8;
  int local_1c0;
  byte local_1b9;
  int evi;
  bool bCopyEdgeCache;
  ON_SubDFacePtr *src_fptr;
  ON_SubDFacePtr *this_fptr;
  ON_SubDEdge *src_edge;
  ON_SubDEdge *this_edge;
  ON_SubDEdgeIdIterator src_eit;
  ON_SubDEdgeIdIterator this_eit;
  undefined1 local_140 [4];
  unsigned_short vfi;
  unsigned_short vei;
  ON_3dPoint local_128;
  ON_3dPoint local_110;
  ON_3dPoint local_f8;
  undefined4 local_e0;
  byte local_d9;
  ON_SubDFace *pOStack_d8;
  bool bCopyVertexCache;
  ON_SubDFace *src_face;
  ON_SubDFace *this_face;
  ON_SubDEdgePtr src_veptr;
  ON_SubDEdgePtr this_veptr;
  ON_SubDVertex *src_vertex;
  ON_SubDVertex *this_vertex;
  undefined1 local_98 [8];
  ON_SubDVertexIdIterator src_vit;
  ON_SubDVertexIdIterator this_vit;
  uint src_level_index;
  uint this_level_index;
  uint subd_display_density;
  uint *copy_status_local;
  ON_SubDHeap *src_heap_local;
  ON_SubDLevel *src_local;
  ON_SubDHeap *this_heap_local;
  ON_SubDLevel *this_local;
  
  *copy_status = 0;
  if ((((this == src) || (this->m_vertex_count != src->m_vertex_count)) ||
      (this->m_edge_count != src->m_edge_count)) || (this->m_face_count != src->m_face_count)) {
    ON_SubDIncrementErrorCount();
    this_local._7_1_ = false;
  }
  else {
    destination_subd_display_density =
         ON_SubDDisplayParameters::AbsoluteDisplayDensityFromSubDFaceCount(4,this->m_face_count);
    level_index = this->m_level_index;
    level_index_00 = src->m_level_index;
    ON_SubDVertexIdIterator::ON_SubDVertexIdIterator
              ((ON_SubDVertexIdIterator *)
               &src_vit.m_subd_ref.m_subd_sp.super___shared_ptr<ON_SubD,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    ON_SubDVertexIdIterator::ON_SubDVertexIdIterator((ON_SubDVertexIdIterator *)local_98);
    ON_SubDHeap::InitializeVertexIdIterator
              (this_heap,
               (ON_SubDVertexIdIterator *)
               &src_vit.m_subd_ref.m_subd_sp.super___shared_ptr<ON_SubD,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    ON_SubDHeap::InitializeVertexIdIterator(src_heap,(ON_SubDVertexIdIterator *)local_98);
    local_d9 = 0;
    src_vertex = ON_SubDVertexIdIterator::FirstVertexOnLevel
                           ((ON_SubDVertexIdIterator *)
                            &src_vit.m_subd_ref.m_subd_sp.
                             super___shared_ptr<ON_SubD,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                            level_index);
    this_veptr.m_ptr =
         (ON__UINT_PTR)
         ON_SubDVertexIdIterator::FirstVertexOnLevel
                   ((ON_SubDVertexIdIterator *)local_98,level_index_00);
    while (src_vertex != (ON_SubDVertex *)0x0 && this_veptr.m_ptr != 0) {
      if ((src_vertex->super_ON_SubDComponentBase).m_id != *(uint *)(this_veptr.m_ptr + 8)) {
        ON_SubDIncrementErrorCount();
        this_local._7_1_ = false;
        local_e0 = 1;
        goto LAB_00899e12;
      }
      if (src_vertex->m_edge_count != *(unsigned_short *)(this_veptr.m_ptr + 0x68)) {
        ON_SubDIncrementErrorCount();
        this_local._7_1_ = false;
        local_e0 = 1;
        goto LAB_00899e12;
      }
      if (src_vertex->m_face_count != *(unsigned_short *)(this_veptr.m_ptr + 0x6a)) {
        ON_SubDIncrementErrorCount();
        this_local._7_1_ = false;
        local_e0 = 1;
        goto LAB_00899e12;
      }
      if (src_vertex->m_vertex_tag != *(ON_SubDVertexTag *)(this_veptr.m_ptr + 0x60)) {
        ON_SubDIncrementErrorCount();
        this_local._7_1_ = false;
        local_e0 = 1;
        goto LAB_00899e12;
      }
      ON_SubDVertex::ControlNetPoint(&local_f8,src_vertex);
      ON_SubDVertex::ControlNetPoint(&local_110,(ON_SubDVertex *)this_veptr.m_ptr);
      bVar2 = ON_3dPoint::operator==(&local_f8,&local_110);
      if (!bVar2) {
        ON_SubDIncrementErrorCount();
        this_local._7_1_ = false;
        local_e0 = 1;
        goto LAB_00899e12;
      }
      bVar1 = ON_SubDComponentBase::SavedSubdivisionPointIsSet
                        (&src_vertex->super_ON_SubDComponentBase);
      bVar2 = false;
      if (bVar1) {
        ON_SubDVertex::SubdivisionPoint(&local_128,src_vertex);
        ON_SubDVertex::SubdivisionPoint((ON_3dPoint *)local_140,(ON_SubDVertex *)this_veptr.m_ptr);
        bVar2 = ON_3dPoint::operator==(&local_128,(ON_3dPoint *)local_140);
        bVar2 = !bVar2;
      }
      if (bVar2) {
        ON_SubDIncrementErrorCount();
        this_local._7_1_ = false;
        local_e0 = 1;
        goto LAB_00899e12;
      }
      bVar2 = ON_SubDComponentBase::SavedSubdivisionPointIsSet
                        (&src_vertex->super_ON_SubDComponentBase);
      if (((!bVar2) || (bVar2 = ON_SubDVertex::SurfacePointIsSet(src_vertex), !bVar2)) &&
         (bVar2 = ON_SubDComponentBase::SavedSubdivisionPointIsSet
                            ((ON_SubDComponentBase *)this_veptr.m_ptr), bVar2)) {
        local_d9 = 1;
        for (this_eit.m_subd_ref.m_subd_sp.super___shared_ptr<ON_SubD,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi._6_2_ = 0;
            this_eit.m_subd_ref.m_subd_sp.super___shared_ptr<ON_SubD,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi._6_2_ < src_vertex->m_edge_count;
            this_eit.m_subd_ref.m_subd_sp.super___shared_ptr<ON_SubD,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi._6_2_ =
                 this_eit.m_subd_ref.m_subd_sp.
                 super___shared_ptr<ON_SubD,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._6_2_ + 1
            ) {
          src_veptr.m_ptr =
               src_vertex->m_edges
               [this_eit.m_subd_ref.m_subd_sp.
                super___shared_ptr<ON_SubD,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._6_2_].
               m_ptr;
          this_face = *(ON_SubDFace **)
                       (*(long *)(this_veptr.m_ptr + 0x70) +
                       (ulong)this_eit.m_subd_ref.m_subd_sp.
                              super___shared_ptr<ON_SubD,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                              _M_pi._6_2_ * 8);
          uVar4 = ON_SubDEdgePtr::EdgeId(&src_veptr);
          uVar3 = ON_SubDEdgePtr::EdgeId((ON_SubDEdgePtr *)&this_face);
          if (uVar4 != uVar3) {
            ON_SubDIncrementErrorCount();
            this_local._7_1_ = false;
            local_e0 = 1;
            goto LAB_00899e12;
          }
          if ((src_veptr.m_ptr & 1) != ((ulong)this_face & 1)) {
            ON_SubDIncrementErrorCount();
            this_local._7_1_ = false;
            local_e0 = 1;
            goto LAB_00899e12;
          }
        }
        for (this_eit.m_subd_ref.m_subd_sp.super___shared_ptr<ON_SubD,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi._4_2_ = 0;
            this_eit.m_subd_ref.m_subd_sp.super___shared_ptr<ON_SubD,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi._4_2_ < src_vertex->m_face_count;
            this_eit.m_subd_ref.m_subd_sp.super___shared_ptr<ON_SubD,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi._4_2_ =
                 this_eit.m_subd_ref.m_subd_sp.
                 super___shared_ptr<ON_SubD,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_2_ + 1
            ) {
          src_face = src_vertex->m_faces
                     [this_eit.m_subd_ref.m_subd_sp.
                      super___shared_ptr<ON_SubD,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
                      _4_2_];
          pOStack_d8 = *(ON_SubDFace **)
                        (*(long *)(this_veptr.m_ptr + 0x78) +
                        (ulong)this_eit.m_subd_ref.m_subd_sp.
                               super___shared_ptr<ON_SubD,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                               _M_pi._4_2_ * 8);
          if (((src_face == (ON_SubDFace *)0x0) || (pOStack_d8 == (ON_SubDFace *)0x0)) ||
             ((src_face->super_ON_SubDComponentBase).m_id !=
              (pOStack_d8->super_ON_SubDComponentBase).m_id)) {
            ON_SubDIncrementErrorCount();
            this_local._7_1_ = false;
            local_e0 = 1;
            goto LAB_00899e12;
          }
        }
      }
      src_vertex = ON_SubDVertexIdIterator::NextVertexOnLevel
                             ((ON_SubDVertexIdIterator *)
                              &src_vit.m_subd_ref.m_subd_sp.
                               super___shared_ptr<ON_SubD,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                              level_index);
      this_veptr.m_ptr =
           (ON__UINT_PTR)
           ON_SubDVertexIdIterator::NextVertexOnLevel
                     ((ON_SubDVertexIdIterator *)local_98,level_index_00);
    }
    if ((src_vertex == (ON_SubDVertex *)0x0) && (this_veptr.m_ptr == 0)) {
      ON_SubDEdgeIdIterator::ON_SubDEdgeIdIterator
                ((ON_SubDEdgeIdIterator *)
                 &src_eit.m_subd_ref.m_subd_sp.
                  super___shared_ptr<ON_SubD,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      ON_SubDEdgeIdIterator::ON_SubDEdgeIdIterator((ON_SubDEdgeIdIterator *)&this_edge);
      ON_SubDHeap::InitializeEdgeIdIterator
                (this_heap,
                 (ON_SubDEdgeIdIterator *)
                 &src_eit.m_subd_ref.m_subd_sp.
                  super___shared_ptr<ON_SubD,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      ON_SubDHeap::InitializeEdgeIdIterator(src_heap,(ON_SubDEdgeIdIterator *)&this_edge);
      local_1b9 = 0;
      src_edge = ON_SubDEdgeIdIterator::FirstEdgeOnLevel
                           ((ON_SubDEdgeIdIterator *)
                            &src_eit.m_subd_ref.m_subd_sp.
                             super___shared_ptr<ON_SubD,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                            level_index);
      this_fptr = (ON_SubDFacePtr *)
                  ON_SubDEdgeIdIterator::FirstEdgeOnLevel
                            ((ON_SubDEdgeIdIterator *)&this_edge,level_index_00);
      while (src_edge != (ON_SubDEdge *)0x0 && this_fptr != (ON_SubDFacePtr *)0x0) {
        if ((src_edge->super_ON_SubDComponentBase).m_id != (uint)this_fptr[1].m_ptr) {
          ON_SubDIncrementErrorCount();
          this_local._7_1_ = false;
          local_e0 = 1;
          goto LAB_00899dde;
        }
        if (src_edge->m_face_count != *(unsigned_short *)((long)&this_fptr[0xc].m_ptr + 4)) {
          ON_SubDIncrementErrorCount();
          this_local._7_1_ = false;
          local_e0 = 1;
          goto LAB_00899dde;
        }
        if (src_edge->m_edge_tag != (ON_SubDEdgeTag)this_fptr[0xc].m_ptr) {
          ON_SubDIncrementErrorCount();
          this_local._7_1_ = false;
          local_e0 = 1;
          goto LAB_00899dde;
        }
        for (local_1c0 = 0; local_1c0 < 2; local_1c0 = local_1c0 + 1) {
          if ((src_edge->m_vertex[local_1c0] == (ON_SubDVertex *)0x0) ||
             (this_fptr[(long)local_1c0 + 0x10].m_ptr == 0)) {
            ON_SubDIncrementErrorCount();
            this_local._7_1_ = false;
            local_e0 = 1;
            goto LAB_00899dde;
          }
          if ((src_edge->m_vertex[local_1c0]->super_ON_SubDComponentBase).m_id !=
              *(uint *)(this_fptr[(long)local_1c0 + 0x10].m_ptr + 8)) {
            ON_SubDIncrementErrorCount();
            this_local._7_1_ = false;
            local_e0 = 1;
            goto LAB_00899dde;
          }
        }
        bVar1 = ON_SubDComponentBase::SavedSubdivisionPointIsSet
                          (&src_edge->super_ON_SubDComponentBase);
        bVar2 = false;
        if (bVar1) {
          ON_SubDEdge::SubdivisionPoint(&local_1d8,src_edge);
          ON_SubDEdge::SubdivisionPoint((ON_3dPoint *)local_1f0,(ON_SubDEdge *)this_fptr);
          bVar2 = ON_3dPoint::operator==(&local_1d8,(ON_3dPoint *)local_1f0);
          bVar2 = !bVar2;
        }
        if (bVar2) {
          ON_SubDIncrementErrorCount();
          this_local._7_1_ = false;
          local_e0 = 1;
          goto LAB_00899dde;
        }
        bVar2 = ON_SubDComponentBase::SavedSubdivisionPointIsSet
                          (&src_edge->super_ON_SubDComponentBase);
        if (((!bVar2) || (bVar2 = ON_SubDEdge::EdgeSurfaceCurveIsSet(src_edge), !bVar2)) &&
           (bVar2 = ON_SubDComponentBase::SavedSubdivisionPointIsSet
                              ((ON_SubDComponentBase *)this_fptr), bVar2)) {
          local_1b9 = 1;
          src_fptr = src_edge->m_face2;
          _evi = this_fptr + 0xd;
          for (this_fit.m_subd_ref.m_subd_sp.super___shared_ptr<ON_SubD,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi._6_2_ = 0;
              this_fit.m_subd_ref.m_subd_sp.super___shared_ptr<ON_SubD,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi._6_2_ < src_edge->m_face_count;
              this_fit.m_subd_ref.m_subd_sp.super___shared_ptr<ON_SubD,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi._6_2_ =
                   this_fit.m_subd_ref.m_subd_sp.
                   super___shared_ptr<ON_SubD,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._6_2_ +
                   1) {
            if (this_fit.m_subd_ref.m_subd_sp.
                super___shared_ptr<ON_SubD,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._6_2_ == 2
               ) {
              src_fptr = src_edge->m_facex;
              _evi = (ON_SubDFacePtr *)this_fptr[0xf].m_ptr;
              if ((src_fptr == (ON_SubDFacePtr *)0x0) || (_evi == (ON_SubDFacePtr *)0x0)) {
                ON_SubDIncrementErrorCount();
                this_local._7_1_ = false;
                local_e0 = 1;
                goto LAB_00899dde;
              }
            }
            src_face = (ON_SubDFace *)(src_fptr->m_ptr & 0xfffffffffffffff8);
            pOStack_d8 = (ON_SubDFace *)(_evi->m_ptr & 0xfffffffffffffff8);
            if (((src_face == (ON_SubDFace *)0x0) || (pOStack_d8 == (ON_SubDFace *)0x0)) ||
               ((src_face->super_ON_SubDComponentBase).m_id !=
                (pOStack_d8->super_ON_SubDComponentBase).m_id)) {
              ON_SubDIncrementErrorCount();
              this_local._7_1_ = false;
              local_e0 = 1;
              goto LAB_00899dde;
            }
            if (src_face->m_edge_count != pOStack_d8->m_edge_count) {
              ON_SubDIncrementErrorCount();
              this_local._7_1_ = false;
              local_e0 = 1;
              goto LAB_00899dde;
            }
            if ((src_fptr->m_ptr & 1) != (_evi->m_ptr & 1)) {
              ON_SubDIncrementErrorCount();
              this_local._7_1_ = false;
              local_e0 = 1;
              goto LAB_00899dde;
            }
            src_fptr = src_fptr + 1;
            _evi = _evi + 1;
          }
        }
        src_edge = ON_SubDEdgeIdIterator::NextEdgeOnLevel
                             ((ON_SubDEdgeIdIterator *)
                              &src_eit.m_subd_ref.m_subd_sp.
                               super___shared_ptr<ON_SubD,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                              level_index);
        this_fptr = (ON_SubDFacePtr *)
                    ON_SubDEdgeIdIterator::NextEdgeOnLevel
                              ((ON_SubDEdgeIdIterator *)&this_edge,level_index_00);
      }
      if ((src_edge == (ON_SubDEdge *)0x0) && (this_fptr == (ON_SubDFacePtr *)0x0)) {
        ON_SubDFaceIdIterator::ON_SubDFaceIdIterator
                  ((ON_SubDFaceIdIterator *)
                   &src_fit.m_subd_ref.m_subd_sp.
                    super___shared_ptr<ON_SubD,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        ON_SubDFaceIdIterator::ON_SubDFaceIdIterator((ON_SubDFaceIdIterator *)&this_eptr);
        ON_SubDHeap::InitializeFaceIdIterator
                  (this_heap,
                   (ON_SubDFaceIdIterator *)
                   &src_fit.m_subd_ref.m_subd_sp.
                    super___shared_ptr<ON_SubD,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        ON_SubDHeap::InitializeFaceIdIterator(src_heap,(ON_SubDFaceIdIterator *)&this_eptr);
        local_259 = 0;
        src_face = ON_SubDFaceIdIterator::FirstFaceOnLevel
                             ((ON_SubDFaceIdIterator *)
                              &src_fit.m_subd_ref.m_subd_sp.
                               super___shared_ptr<ON_SubD,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                              level_index);
        pOStack_d8 = ON_SubDFaceIdIterator::FirstFaceOnLevel
                               ((ON_SubDFaceIdIterator *)&this_eptr,level_index_00);
        while (src_face != (ON_SubDFace *)0x0 && pOStack_d8 != (ON_SubDFace *)0x0) {
          if ((src_face->super_ON_SubDComponentBase).m_id !=
              (pOStack_d8->super_ON_SubDComponentBase).m_id) {
            ON_SubDIncrementErrorCount();
            this_local._7_1_ = false;
            goto LAB_00899daa;
          }
          if (src_face->m_edge_count != pOStack_d8->m_edge_count) {
            ON_SubDIncrementErrorCount();
            this_local._7_1_ = false;
            goto LAB_00899daa;
          }
          bVar1 = ON_SubDComponentBase::SavedSubdivisionPointIsSet
                            (&src_face->super_ON_SubDComponentBase);
          bVar2 = false;
          if (bVar1) {
            ON_SubDFace::SubdivisionPoint(&local_278,src_face);
            ON_SubDFace::SubdivisionPoint((ON_3dPoint *)local_290,pOStack_d8);
            bVar2 = ON_3dPoint::operator==(&local_278,(ON_3dPoint *)local_290);
            bVar2 = !bVar2;
          }
          if (bVar2) {
            ON_SubDIncrementErrorCount();
            this_local._7_1_ = false;
            goto LAB_00899daa;
          }
          bVar2 = ON_SubDComponentBase::SavedSubdivisionPointIsSet
                            (&src_face->super_ON_SubDComponentBase);
          if (((!bVar2) ||
              (pOVar5 = ON_SubDFace::MeshFragments(src_face), pOVar5 == (ON_SubDMeshFragment *)0x0))
             && (bVar2 = ON_SubDComponentBase::SavedSubdivisionPointIsSet
                                   (&pOStack_d8->super_ON_SubDComponentBase), bVar2)) {
            local_259 = 1;
            src_eptr = src_face->m_edge4;
            pOStack_258 = pOStack_d8->m_edge4;
            for (local_292 = 0; local_292 < src_face->m_edge_count; local_292 = local_292 + 1) {
              if (local_292 == 4) {
                src_eptr = src_face->m_edgex;
                pOStack_258 = pOStack_d8->m_edgex;
                if ((src_eptr == (ON_SubDEdgePtr *)0x0) || (pOStack_258 == (ON_SubDEdgePtr *)0x0)) {
                  ON_SubDIncrementErrorCount();
                  this_local._7_1_ = false;
                  goto LAB_00899daa;
                }
              }
              uVar4 = ON_SubDEdgePtr::EdgeId(src_eptr);
              uVar3 = ON_SubDEdgePtr::EdgeId(pOStack_258);
              if (uVar4 != uVar3) {
                ON_SubDIncrementErrorCount();
                this_local._7_1_ = false;
                goto LAB_00899daa;
              }
              if ((src_eptr->m_ptr & 1) != (pOStack_258->m_ptr & 1)) {
                ON_SubDIncrementErrorCount();
                this_local._7_1_ = false;
                goto LAB_00899daa;
              }
              src_eptr = src_eptr + 1;
              pOStack_258 = pOStack_258 + 1;
            }
          }
          src_face = ON_SubDFaceIdIterator::NextFaceOnLevel
                               ((ON_SubDFaceIdIterator *)
                                &src_fit.m_subd_ref.m_subd_sp.
                                 super___shared_ptr<ON_SubD,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                                ,level_index);
          pOStack_d8 = ON_SubDFaceIdIterator::NextFaceOnLevel
                                 ((ON_SubDFaceIdIterator *)&this_eptr,level_index_00);
        }
        if ((src_face == (ON_SubDFace *)0x0) && (pOStack_d8 == (ON_SubDFace *)0x0)) {
          if ((((local_d9 & 1) == 0) && ((local_1b9 & 1) == 0)) && ((local_259 & 1) == 0)) {
            this_local._7_1_ = false;
          }
          else {
            if ((local_d9 & 1) != 0) {
              src_vertex = ON_SubDVertexIdIterator::FirstVertexOnLevel
                                     ((ON_SubDVertexIdIterator *)
                                      &src_vit.m_subd_ref.m_subd_sp.
                                       super___shared_ptr<ON_SubD,_(__gnu_cxx::_Lock_policy)2>.
                                       _M_refcount,level_index);
              this_veptr.m_ptr =
                   (ON__UINT_PTR)
                   ON_SubDVertexIdIterator::FirstVertexOnLevel
                             ((ON_SubDVertexIdIterator *)local_98,level_index_00);
              while (src_vertex != (ON_SubDVertex *)0x0 && this_veptr.m_ptr != 0) {
                bVar2 = ON_SubDComponentBase::GetSavedSubdivisionPoint
                                  ((ON_SubDComponentBase *)this_veptr.m_ptr,
                                   (double *)&this_limit_point.m_sector_face);
                if (bVar2) {
                  bVar2 = ON_SubDComponentBase::SavedSubdivisionPointIsSet
                                    (&src_vertex->super_ON_SubDComponentBase);
                  if (!bVar2) {
                    ON_SubDComponentBase::SetSavedSubdivisionPoint
                              (&src_vertex->super_ON_SubDComponentBase,
                               (double *)&this_limit_point.m_sector_face);
                  }
                  bVar2 = ON_SubDVertex::SurfacePointIsSet(src_vertex);
                  if (!bVar2) {
                    for (pOStack_330 = ON_SubDVertex::SectorSurfacePointForExperts
                                                 ((ON_SubDVertex *)this_veptr.m_ptr);
                        pOStack_330 != (ON_SubDSectorSurfacePoint *)0x0;
                        pOStack_330 = pOStack_330->m_next_sector_limit_point) {
                      memcpy(&src_limit_point,pOStack_330,0x70);
                      this_limit_point.m_limitN[2] = 4.94065645841247e-324;
                      this_limit_point.m_next_sector_limit_point = (ON_SubDSectorSurfacePoint *)0x0;
                      if (pOStack_330->m_sector_face != (ON_SubDFace *)0x0) {
                        uVar4 = ON_SubDVertex::FaceArrayIndex
                                          ((ON_SubDVertex *)this_veptr.m_ptr,
                                           pOStack_330->m_sector_face);
                        if (*(ushort *)(this_veptr.m_ptr + 0x6a) <= uVar4) break;
                        this_limit_point.m_next_sector_limit_point =
                             (ON_SubDSectorSurfacePoint *)src_vertex->m_faces[uVar4];
                      }
                      edge_curve_cvs._16_8_ = src_limit_point;
                      limit_point.m_limitP[1] = this_limit_point.m_limitP[0];
                      limit_point.m_limitP[0] = (double)src_limit_point;
                      limit_point.m_limitP[2] = this_limit_point.m_limitP[1];
                      limit_point.m_limitT1[0] = this_limit_point.m_limitP[2];
                      limit_point.m_limitT1[1] = this_limit_point.m_limitT1[0];
                      limit_point.m_limitT1[2] = this_limit_point.m_limitT1[1];
                      limit_point.m_limitT2[0] = this_limit_point.m_limitT1[2];
                      limit_point.m_limitT2[1] = this_limit_point.m_limitT2[0];
                      limit_point.m_limitT2[2] = this_limit_point.m_limitT2[1];
                      limit_point.m_limitN[0] = this_limit_point.m_limitT2[2];
                      limit_point.m_limitN[1] = this_limit_point.m_limitN[0];
                      limit_point.m_limitN[2] = this_limit_point.m_limitN[1];
                      limit_point.m_next_sector_limit_point =
                           (ON_SubDSectorSurfacePoint *)this_limit_point.m_limitN[2];
                      limit_point.m_sector_face =
                           (ON_SubDFace *)this_limit_point.m_next_sector_limit_point;
                      ON_SubDVertex::SetSavedSurfacePoint(src_vertex,true,limit_point);
                    }
                  }
                }
                src_vertex = ON_SubDVertexIdIterator::NextVertexOnLevel
                                       ((ON_SubDVertexIdIterator *)
                                        &src_vit.m_subd_ref.m_subd_sp.
                                         super___shared_ptr<ON_SubD,_(__gnu_cxx::_Lock_policy)2>.
                                         _M_refcount,level_index);
                this_veptr.m_ptr =
                     (ON__UINT_PTR)
                     ON_SubDVertexIdIterator::NextVertexOnLevel
                               ((ON_SubDVertexIdIterator *)local_98,level_index_00);
              }
            }
            if ((local_1b9 & 1) != 0) {
              ON_SimpleArray<ON_3dPoint>::ON_SimpleArray
                        ((ON_SimpleArray<ON_3dPoint> *)&this_frag,0x13);
              src_edge = ON_SubDEdgeIdIterator::FirstEdgeOnLevel
                                   ((ON_SubDEdgeIdIterator *)
                                    &src_eit.m_subd_ref.m_subd_sp.
                                     super___shared_ptr<ON_SubD,_(__gnu_cxx::_Lock_policy)2>.
                                     _M_refcount,level_index);
              this_fptr = (ON_SubDFacePtr *)
                          ON_SubDEdgeIdIterator::FirstEdgeOnLevel
                                    ((ON_SubDEdgeIdIterator *)&this_edge,level_index_00);
              while (src_edge != (ON_SubDEdge *)0x0 && this_fptr != (ON_SubDFacePtr *)0x0) {
                bVar2 = ON_SubDComponentBase::GetSavedSubdivisionPoint
                                  ((ON_SubDComponentBase *)this_fptr,
                                   (double *)&this_limit_point.m_sector_face);
                if (bVar2) {
                  bVar2 = ON_SubDComponentBase::SavedSubdivisionPointIsSet
                                    (&src_edge->super_ON_SubDComponentBase);
                  if (!bVar2) {
                    ON_SubDComponentBase::SetSavedSubdivisionPoint
                              (&src_edge->super_ON_SubDComponentBase,
                               (double *)&this_limit_point.m_sector_face);
                  }
                  bVar2 = ON_SubDEdge::EdgeSurfaceCurveIsSet(src_edge);
                  if ((!bVar2) &&
                     (bVar2 = ON_SubDEdge::EdgeSurfaceCurveIsSet((ON_SubDEdge *)this_fptr), bVar2))
                  {
                    ON_SubDHeap::CopyEdgeSurfaceCurve(this_heap,(ON_SubDEdge *)this_fptr,src_edge);
                  }
                }
                src_edge = ON_SubDEdgeIdIterator::NextEdgeOnLevel
                                     ((ON_SubDEdgeIdIterator *)
                                      &src_eit.m_subd_ref.m_subd_sp.
                                       super___shared_ptr<ON_SubD,_(__gnu_cxx::_Lock_policy)2>.
                                       _M_refcount,level_index);
                this_fptr = (ON_SubDFacePtr *)
                            ON_SubDEdgeIdIterator::NextEdgeOnLevel
                                      ((ON_SubDEdgeIdIterator *)&this_edge,level_index_00);
              }
              ON_SimpleArray<ON_3dPoint>::~ON_SimpleArray((ON_SimpleArray<ON_3dPoint> *)&this_frag);
            }
            if ((local_259 & 1) != 0) {
              src_face = ON_SubDFaceIdIterator::FirstFaceOnLevel
                                   ((ON_SubDFaceIdIterator *)
                                    &src_fit.m_subd_ref.m_subd_sp.
                                     super___shared_ptr<ON_SubD,_(__gnu_cxx::_Lock_policy)2>.
                                     _M_refcount,level_index);
              pOStack_d8 = ON_SubDFaceIdIterator::FirstFaceOnLevel
                                     ((ON_SubDFaceIdIterator *)&this_eptr,level_index_00);
              while (src_face != (ON_SubDFace *)0x0 && pOStack_d8 != (ON_SubDFace *)0x0) {
                bVar2 = ON_SubDComponentBase::GetSavedSubdivisionPoint
                                  (&pOStack_d8->super_ON_SubDComponentBase,
                                   (double *)&this_limit_point.m_sector_face);
                if (bVar2) {
                  bVar2 = ON_SubDComponentBase::SavedSubdivisionPointIsSet
                                    (&src_face->super_ON_SubDComponentBase);
                  if (!bVar2) {
                    ON_SubDComponentBase::SetSavedSubdivisionPoint
                              (&src_face->super_ON_SubDComponentBase,
                               (double *)&this_limit_point.m_sector_face);
                  }
                  pOVar5 = ON_SubDFace::MeshFragments(src_face);
                  if (((pOVar5 == (ON_SubDMeshFragment *)0x0) &&
                      (pOVar5 = ON_SubDFace::MeshFragments(pOStack_d8),
                      pOVar5 != (ON_SubDMeshFragment *)0x0)) &&
                     (pOVar5 = ON_SubDHeap::CopyMeshFragments
                                         (this_heap,pOStack_d8,destination_subd_display_density,
                                          src_face), pOVar5 != (ON_SubDMeshFragment *)0x0)) {
                    *copy_status = *copy_status | 1;
                    uVar4 = ON_SubDMeshFragment::TextureCoordinateCount(pOVar5);
                    if (uVar4 != 0) {
                      *copy_status = *copy_status | 2;
                    }
                    uVar4 = ON_SubDMeshFragment::CurvatureCount(pOVar5);
                    if (uVar4 != 0) {
                      *copy_status = *copy_status | 4;
                    }
                    uVar4 = ON_SubDMeshFragment::ColorCount(pOVar5);
                    if (uVar4 != 0) {
                      *copy_status = *copy_status | 8;
                    }
                  }
                }
                src_face = ON_SubDFaceIdIterator::NextFaceOnLevel
                                     ((ON_SubDFaceIdIterator *)
                                      &src_fit.m_subd_ref.m_subd_sp.
                                       super___shared_ptr<ON_SubD,_(__gnu_cxx::_Lock_policy)2>.
                                       _M_refcount,level_index);
                pOStack_d8 = ON_SubDFaceIdIterator::NextFaceOnLevel
                                       ((ON_SubDFaceIdIterator *)&this_eptr,level_index_00);
              }
            }
            this_local._7_1_ = true;
          }
        }
        else {
          ON_SubDIncrementErrorCount();
          this_local._7_1_ = false;
        }
LAB_00899daa:
        local_e0 = 1;
        ON_SubDFaceIdIterator::~ON_SubDFaceIdIterator((ON_SubDFaceIdIterator *)&this_eptr);
        ON_SubDFaceIdIterator::~ON_SubDFaceIdIterator
                  ((ON_SubDFaceIdIterator *)
                   &src_fit.m_subd_ref.m_subd_sp.
                    super___shared_ptr<ON_SubD,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      }
      else {
        ON_SubDIncrementErrorCount();
        this_local._7_1_ = false;
        local_e0 = 1;
      }
LAB_00899dde:
      ON_SubDEdgeIdIterator::~ON_SubDEdgeIdIterator((ON_SubDEdgeIdIterator *)&this_edge);
      ON_SubDEdgeIdIterator::~ON_SubDEdgeIdIterator
                ((ON_SubDEdgeIdIterator *)
                 &src_eit.m_subd_ref.m_subd_sp.
                  super___shared_ptr<ON_SubD,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    }
    else {
      ON_SubDIncrementErrorCount();
      this_local._7_1_ = false;
      local_e0 = 1;
    }
LAB_00899e12:
    ON_SubDVertexIdIterator::~ON_SubDVertexIdIterator((ON_SubDVertexIdIterator *)local_98);
    ON_SubDVertexIdIterator::~ON_SubDVertexIdIterator
              ((ON_SubDVertexIdIterator *)
               &src_vit.m_subd_ref.m_subd_sp.super___shared_ptr<ON_SubD,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
  }
  return this_local._7_1_;
}

Assistant:

bool ON_SubDLevel::CopyEvaluationCacheForExperts( ON_SubDHeap& this_heap, const ON_SubDLevel& src, const ON_SubDHeap& src_heap, unsigned& copy_status)
{
  copy_status = 0u;
  // Validate conditions for coping the cached evaluation information
  if (
    this == &src
    || m_vertex_count != src.m_vertex_count
    || m_edge_count != src.m_edge_count
    || m_face_count != src.m_face_count
    )
    return ON_SUBD_RETURN_ERROR(false);

  // The built in fragment cache always has adaptive ON_SubDDisplayParameters::DefaultDensity
  unsigned subd_display_density = ON_SubDDisplayParameters::AbsoluteDisplayDensityFromSubDFaceCount(ON_SubDDisplayParameters::DefaultDensity,m_face_count);
  const unsigned this_level_index = this->m_level_index;
  const unsigned src_level_index = src.m_level_index;

  // It is critical to use the this_vit/src_vit iterators so we got through the vertices in id order.
  // When a copy of an edited subd is made, it is frequently the case that the vertex linked lists
  // are in different order. 
  ON_SubDVertexIdIterator this_vit;
  ON_SubDVertexIdIterator src_vit;
  this_heap.InitializeVertexIdIterator(this_vit);
  src_heap.InitializeVertexIdIterator(src_vit);

  ON_SubDVertex* this_vertex;
  const ON_SubDVertex* src_vertex;
  ON_SubDEdgePtr this_veptr, src_veptr;
  ON_SubDFace* this_face;
  const ON_SubDFace* src_face;
  bool bCopyVertexCache = false;
  for (
    this_vertex = const_cast<ON_SubDVertex*>(this_vit.FirstVertexOnLevel(this_level_index)), src_vertex = src_vit.FirstVertexOnLevel(src_level_index);
    nullptr != this_vertex && nullptr != src_vertex; 
    this_vertex = const_cast<ON_SubDVertex*>(this_vit.NextVertexOnLevel(this_level_index)), src_vertex = src_vit.NextVertexOnLevel(src_level_index)
    )
  {
    if (this_vertex->m_id != src_vertex->m_id)
      return ON_SUBD_RETURN_ERROR(false);
    if (this_vertex->m_edge_count != src_vertex->m_edge_count)
      return ON_SUBD_RETURN_ERROR(false);
    if (this_vertex->m_face_count != src_vertex->m_face_count)
      return ON_SUBD_RETURN_ERROR(false);
    if (this_vertex->m_vertex_tag != src_vertex->m_vertex_tag)
      return ON_SUBD_RETURN_ERROR(false);
    if (false == (this_vertex->ControlNetPoint() == src_vertex->ControlNetPoint()))
      return ON_SUBD_RETURN_ERROR(false);
    if (this_vertex->SavedSubdivisionPointIsSet() && false == (this_vertex->SubdivisionPoint() == src_vertex->SubdivisionPoint()))
      return ON_SUBD_RETURN_ERROR(false);
    if (this_vertex->SavedSubdivisionPointIsSet() && this_vertex->SurfacePointIsSet())
      continue;
    if (false == src_vertex->SavedSubdivisionPointIsSet())
      continue;
    bCopyVertexCache = true;
    for (unsigned short vei = 0; vei < this_vertex->m_edge_count; ++vei)
    {
      this_veptr = this_vertex->m_edges[vei];
      src_veptr = src_vertex->m_edges[vei];
      if ( this_veptr.EdgeId() != src_veptr.EdgeId())
        return ON_SUBD_RETURN_ERROR(false);
      if (ON_SUBD_EDGE_DIRECTION(this_veptr.m_ptr) != ON_SUBD_EDGE_DIRECTION(src_veptr.m_ptr))
        return ON_SUBD_RETURN_ERROR(false);
    }
    for (unsigned short vfi = 0; vfi < this_vertex->m_face_count; ++vfi)
    {
      this_face = const_cast<ON_SubDFace*>(this_vertex->m_faces[vfi]);
      src_face = src_vertex->m_faces[vfi];
      if (nullptr == this_face || nullptr == src_face || this_face->m_id != src_face->m_id)
        return ON_SUBD_RETURN_ERROR(false);
    }
  }
  if (nullptr != this_vertex || nullptr != src_vertex)
    return ON_SUBD_RETURN_ERROR(false);

  // It is critical to use the this_eit/src_eit iterators so we got through the edges in id order.
  // When a copy of an edited subd is made, it is frequently the case that the edge linked lists
  // are in different order. 
  ON_SubDEdgeIdIterator this_eit;
  ON_SubDEdgeIdIterator src_eit;
  this_heap.InitializeEdgeIdIterator(this_eit);
  src_heap.InitializeEdgeIdIterator(src_eit);

  ON_SubDEdge* this_edge;
  const ON_SubDEdge* src_edge;
  const ON_SubDFacePtr* this_fptr;
  const ON_SubDFacePtr* src_fptr;
  bool bCopyEdgeCache = false;
  for (
    this_edge = const_cast<ON_SubDEdge*>(this_eit.FirstEdgeOnLevel(this_level_index)), src_edge = src_eit.FirstEdgeOnLevel(src_level_index);
    nullptr != this_edge && nullptr != src_edge;
    this_edge = const_cast<ON_SubDEdge*>(this_eit.NextEdgeOnLevel(this_level_index)), src_edge = src_eit.NextEdgeOnLevel(src_level_index)
    )
  {
    if (this_edge->m_id != src_edge->m_id)
      return ON_SUBD_RETURN_ERROR(false);
    if (this_edge->m_face_count != src_edge->m_face_count)
      return ON_SUBD_RETURN_ERROR(false);
    if (this_edge->m_edge_tag != src_edge->m_edge_tag)
      return ON_SUBD_RETURN_ERROR(false);
    for (int evi = 0; evi < 2; ++evi)
    {
      if (nullptr == this_edge->m_vertex[evi] || nullptr == src_edge->m_vertex[evi])
        return ON_SUBD_RETURN_ERROR(false);
      if (this_edge->m_vertex[evi]->m_id != src_edge->m_vertex[evi]->m_id)
        return ON_SUBD_RETURN_ERROR(false);
    }
    if (this_edge->SavedSubdivisionPointIsSet() && false == (this_edge->SubdivisionPoint() == src_edge->SubdivisionPoint()))
      return ON_SUBD_RETURN_ERROR(false);
    if (this_edge->SavedSubdivisionPointIsSet() && this_edge->EdgeSurfaceCurveIsSet())
      continue;
    if (false == src_edge->SavedSubdivisionPointIsSet())
      continue;
    bCopyEdgeCache = true;
    this_fptr = this_edge->m_face2;
    src_fptr = src_edge->m_face2;
    for (unsigned short efi = 0; efi < this_edge->m_face_count; ++efi, ++this_fptr, ++src_fptr)
    {
      if (2 == efi)
      {
        this_fptr = this_edge->m_facex;
        src_fptr = src_edge->m_facex;
        if (nullptr == this_fptr || nullptr == src_fptr)
          return ON_SUBD_RETURN_ERROR(false);
      }
      this_face = ON_SUBD_FACE_POINTER(this_fptr->m_ptr);
      src_face = ON_SUBD_FACE_POINTER(src_fptr->m_ptr);
      if (nullptr == this_face || nullptr == src_face || this_face->m_id != src_face->m_id )
        return ON_SUBD_RETURN_ERROR(false);
      if ( this_face->m_edge_count != src_face->m_edge_count )
        return ON_SUBD_RETURN_ERROR(false);
      if (ON_SUBD_FACE_DIRECTION(this_fptr->m_ptr) != ON_SUBD_FACE_DIRECTION(src_fptr->m_ptr))
        return ON_SUBD_RETURN_ERROR(false);
    }
  }
  if (nullptr != this_edge || nullptr != src_edge)
    return ON_SUBD_RETURN_ERROR(false);

  // It is critical to use the this_fit/src_fit iterators so we got through the faces in id order.
  // When a copy of an edited subd is made, it is frequently the case that the face linked lists
  // are in different order. 
  ON_SubDFaceIdIterator this_fit;
  ON_SubDFaceIdIterator src_fit;
  this_heap.InitializeFaceIdIterator(this_fit);
  src_heap.InitializeFaceIdIterator(src_fit);

  const ON_SubDEdgePtr* this_eptr;
  const ON_SubDEdgePtr* src_eptr;
  bool bCopyFaceCache = false;
  for (
    this_face = const_cast<ON_SubDFace*>(this_fit.FirstFaceOnLevel(this_level_index)), src_face = src_fit.FirstFaceOnLevel(src_level_index);
    nullptr != this_face && nullptr != src_face;
    this_face = const_cast<ON_SubDFace*>(this_fit.NextFaceOnLevel(this_level_index)), src_face = src_fit.NextFaceOnLevel(src_level_index)
    )
  {
    if (this_face->m_id != src_face->m_id)
      return ON_SUBD_RETURN_ERROR(false);
    if (this_face->m_edge_count != src_face->m_edge_count)
      return ON_SUBD_RETURN_ERROR(false);
    if (this_face->SavedSubdivisionPointIsSet() && false == (this_face->SubdivisionPoint() == src_face->SubdivisionPoint()) )
      return ON_SUBD_RETURN_ERROR(false);
    if (this_face->SavedSubdivisionPointIsSet() && nullptr != this_face->MeshFragments())
      continue;
    if (false == src_face->SavedSubdivisionPointIsSet())
      continue;
    bCopyFaceCache = true;
    this_eptr = this_face->m_edge4;
    src_eptr = src_face->m_edge4;
    for (unsigned short fei = 0; fei < this_face->m_edge_count; ++fei, ++this_eptr, ++src_eptr)
    {
      if (4 == fei)
      {
        this_eptr = this_face->m_edgex;
        src_eptr = src_face->m_edgex;
        if(nullptr == this_eptr || nullptr == src_eptr)
          return ON_SUBD_RETURN_ERROR(false);
      }
      if ( this_eptr->EdgeId() != src_eptr->EdgeId())
        return ON_SUBD_RETURN_ERROR(false);
      if ( ON_SUBD_EDGE_DIRECTION(this_eptr->m_ptr) != ON_SUBD_EDGE_DIRECTION(src_eptr->m_ptr))
        return ON_SUBD_RETURN_ERROR(false);
    }
  }
  if (nullptr != this_face || nullptr != src_face)
    return ON_SUBD_RETURN_ERROR(false);

  if (false == bCopyVertexCache && false == bCopyEdgeCache && false == bCopyFaceCache)
    return false;

  // this and src subd have identical geometry - copy evaluation cache

  double subdivision_point[3];
  if (bCopyVertexCache)
  {
    // It is critical to use the this_vit/src_vit iterators so we got through the vertices in id order.
    // When a copy of an edited subd is made, it is frequently the case that the vertex linked lists
    // are in different order. 
    ON_SubDSectorSurfacePoint this_limit_point;
    for (
      this_vertex = const_cast<ON_SubDVertex*>(this_vit.FirstVertexOnLevel(this_level_index)), src_vertex = src_vit.FirstVertexOnLevel(src_level_index);
      nullptr != this_vertex && nullptr != src_vertex;
      this_vertex = const_cast<ON_SubDVertex*>(this_vit.NextVertexOnLevel(this_level_index)), src_vertex = src_vit.NextVertexOnLevel(src_level_index)
      )
    {
      if (false == src_vertex->GetSavedSubdivisionPoint(subdivision_point))
        continue;
      if (false == this_vertex->SavedSubdivisionPointIsSet())
        this_vertex->SetSavedSubdivisionPoint(subdivision_point);
     
      if (false == this_vertex->SurfacePointIsSet())
      {
        for (const ON_SubDSectorSurfacePoint* src_limit_point = &src_vertex->SectorSurfacePointForExperts(); nullptr != src_limit_point; src_limit_point = src_limit_point->m_next_sector_limit_point)
        {
          this_limit_point = *src_limit_point;
          this_limit_point.m_next_sector_limit_point = (ON_SubDSectorSurfacePoint*)1;
          this_limit_point.m_sector_face = nullptr;
          if (nullptr != src_limit_point->m_sector_face)
          {
            const unsigned vfi = src_vertex->FaceArrayIndex(src_limit_point->m_sector_face);
            if (vfi >= src_vertex->m_face_count)
              break;
            this_limit_point.m_sector_face = this_vertex->m_faces[vfi];
          }
          this_vertex->SetSavedSurfacePoint(true, this_limit_point);
        }
      }
    }
  }

  if (bCopyEdgeCache)
  {    
    // It is critical to use the this_eit/src_eit iterators so we got through the edges in id order.
    // When a copy of an edited subd is made, it is frequently the case that the edge linked lists
    // are in different order. 
    ON_SimpleArray<ON_3dPoint> edge_curve_cvs(ON_SubDEdgeSurfaceCurve::MaximumControlPointCapacity);
    for (
      this_edge = const_cast<ON_SubDEdge*>(this_eit.FirstEdgeOnLevel(this_level_index)), src_edge = src_eit.FirstEdgeOnLevel(src_level_index);
      nullptr != this_edge && nullptr != src_edge;
      this_edge = const_cast<ON_SubDEdge*>(this_eit.NextEdgeOnLevel(this_level_index)), src_edge = src_eit.NextEdgeOnLevel(src_level_index)
      )
    {
      if (false == src_edge->GetSavedSubdivisionPoint(subdivision_point))
        continue;
      if (false == this_edge->SavedSubdivisionPointIsSet())
        this_edge->SetSavedSubdivisionPoint(subdivision_point);
      if ( false == this_edge->EdgeSurfaceCurveIsSet() && src_edge->EdgeSurfaceCurveIsSet( ))
        this_heap.CopyEdgeSurfaceCurve(src_edge, this_edge);
    }
  }

  if (bCopyFaceCache)
  {
    // It is critical to use the this_fit/src_fit iterators so we got through the faces in id order.
    // When a copy of an edited subd is made, it is frequently the case that the face linked lists
    // are in different order. 
    for (
      this_face = const_cast<ON_SubDFace*>(this_fit.FirstFaceOnLevel(this_level_index)), src_face = src_fit.FirstFaceOnLevel(src_level_index);
      nullptr != this_face && nullptr != src_face;
      this_face = const_cast<ON_SubDFace*>(this_fit.NextFaceOnLevel(this_level_index)), src_face = src_fit.NextFaceOnLevel(src_level_index)
      )
    {
      if (false == src_face->GetSavedSubdivisionPoint(subdivision_point))
        continue;
      if ( false == this_face->SavedSubdivisionPointIsSet())
        this_face->SetSavedSubdivisionPoint(subdivision_point);
      if (nullptr == this_face->MeshFragments() && nullptr != src_face->MeshFragments())
      {
        const ON_SubDMeshFragment* this_frag = this_heap.CopyMeshFragments(src_face, subd_display_density, this_face);
        if (nullptr != this_frag)
        {
          copy_status |= 1u;
          if (this_frag->TextureCoordinateCount() > 0)
            copy_status |= 2u;
          if (this_frag->CurvatureCount() > 0)
            copy_status |= 4u;
          if (this_frag->ColorCount() > 0)
            copy_status |= 8u;
        }
      }
    }
  }

  return true;
}